

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

void __thiscall
FreeTypeFaceWrapper::FreeTypeFaceWrapper
          (FreeTypeFaceWrapper *this,FT_Face inFace,string *inFontFilePath,string *inPFMFilePath,
          long inFontIndex,bool inDoOwn)

{
  bool bVar1;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  string fileExtension;
  bool inDoOwn_local;
  long inFontIndex_local;
  string *inPFMFilePath_local;
  string *inFontFilePath_local;
  FT_Face inFace_local;
  FreeTypeFaceWrapper *this_local;
  
  std::__cxx11::string::string((string *)&this->mFontFilePath);
  std::__cxx11::string::string((string *)&this->mNotDefGlyphName);
  this->mFace = inFace;
  std::__cxx11::string::operator=((string *)&this->mFontFilePath,(string *)inFontFilePath);
  this->mFontIndex = inFontIndex;
  this->mDoesOwn = inDoOwn;
  this->mGlyphIsLoaded = false;
  ResetPaletteSelectionState(this);
  GetExtension((string *)local_68,this,inPFMFilePath);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,"PFM");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"pfm");
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
      SetupFormatSpecificExtender(this,inFontFilePath,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      goto LAB_0020dcae;
    }
  }
  SetupFormatSpecificExtender(this,inFontFilePath,inPFMFilePath);
LAB_0020dcae:
  SelectDefaultEncoding(this);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

FreeTypeFaceWrapper::FreeTypeFaceWrapper(FT_Face inFace,const std::string& inFontFilePath,const std::string& inPFMFilePath,long inFontIndex, bool inDoOwn)
{
    mFace = inFace;
	mFontFilePath = inFontFilePath;
    mFontIndex = inFontIndex;
	mDoesOwn = inDoOwn;
	mGlyphIsLoaded = false;
	ResetPaletteSelectionState();
	std::string fileExtension = GetExtension(inPFMFilePath);
	if (fileExtension == "PFM" || fileExtension == "pfm") // just don't bother if it's not PFM
		SetupFormatSpecificExtender(inFontFilePath, inPFMFilePath);
	else
		SetupFormatSpecificExtender(inFontFilePath, "");
	SelectDefaultEncoding();
}